

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall
pbrt::ShapeSceneEntity::ShapeSceneEntity
          (ShapeSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          Transform *renderFromObject,Transform *objectFromRender,bool reverseOrientation,
          int materialIndex,string *materialName,int lightIndex,string *insideMedium,
          string *outsideMedium)

{
  FileLoc loc_00;
  undefined8 in_RCX;
  ParameterDictionary *in_RDX;
  SceneEntity *in_RDI;
  size_type in_R8;
  byte in_R9B;
  undefined4 in_stack_00000020;
  string *in_stack_00000028;
  undefined4 in_stack_00000030;
  string *in_stack_00000038;
  string *in_stack_00000040;
  ParameterDictionary *in_stack_fffffffffffffef8;
  ParameterDictionary *in_stack_ffffffffffffff00;
  string *name_00;
  undefined1 *puVar1;
  undefined1 in_stack_ffffffffffffff38 [16];
  undefined1 local_98 [111];
  byte local_29;
  size_type local_28;
  undefined8 local_20;
  
  name_00 = (string *)&stack0x00000008;
  local_29 = in_R9B & 1;
  puVar1 = local_98;
  local_28 = in_R8;
  local_20 = in_RCX;
  ParameterDictionary::ParameterDictionary(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  loc_00.filename._M_str = (char *)in_stack_ffffffffffffff38._0_8_;
  loc_00.line = in_stack_ffffffffffffff38._8_4_;
  loc_00.column = in_stack_ffffffffffffff38._12_4_;
  loc_00.filename._M_len = (size_t)puVar1;
  SceneEntity::SceneEntity(in_RDI,name_00,in_RDX,loc_00);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x68f41a);
  *(undefined8 *)&in_RDI[1].name = local_20;
  in_RDI[1].name._M_string_length = local_28;
  in_RDI[1].name.field_2._M_local_buf[0] = local_29 & 1;
  *(undefined4 *)((long)&in_RDI[1].name.field_2 + 4) = in_stack_00000020;
  std::__cxx11::string::string
            ((string *)(in_RDI[1].name.field_2._M_local_buf + 8),in_stack_00000028);
  *(undefined4 *)((long)&in_RDI[1].parameters.params.field_2 + 8) = in_stack_00000030;
  std::__cxx11::string::string
            ((string *)((long)&in_RDI[1].parameters.params.field_2 + 0x10),in_stack_00000038);
  std::__cxx11::string::string
            ((string *)((long)&in_RDI[1].parameters.params.field_2 + 0x30),in_stack_00000040);
  return;
}

Assistant:

ShapeSceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc,
                     const Transform *renderFromObject, const Transform *objectFromRender,
                     bool reverseOrientation, int materialIndex,
                     const std::string &materialName, int lightIndex,
                     const std::string &insideMedium, const std::string &outsideMedium)
        : SceneEntity(name, parameters, loc),
          renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          materialIndex(materialIndex),
          materialName(materialName),
          lightIndex(lightIndex),
          insideMedium(insideMedium),
          outsideMedium(outsideMedium) {}